

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBars<long_long>
               (char *label_id,longlong *xs,longlong *ys,int count,double width,int offset,
               int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<long_long> getter;
  int stride_local;
  int offset_local;
  double width_local;
  int count_local;
  longlong *ys_local;
  longlong *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<long_long>::GetterXsYs((GetterXsYs<long_long> *)local_58,xs,ys,count,offset,stride);
  PlotBarsEx<ImPlot::GetterXsYs<long_long>>(label_id,(GetterXsYs<long_long> *)local_58,width);
  return;
}

Assistant:

void PlotBars(const char* label_id, const T* xs, const T* ys, int count, double width, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsEx(label_id, getter, width);
}